

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.h
# Opt level: O1

df_iterator * __thiscall
spvtools::opt::DominatorTreeNode::df_end
          (df_iterator *__return_storage_ptr__,DominatorTreeNode *this)

{
  pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>
  local_20;
  
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  __return_storage_ptr__->current_ = (NodePtr)0x0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                       *)&__return_storage_ptr__->parent_iterators_,0);
  local_20.first = __return_storage_ptr__->current_;
  if ((local_20.first != (NodePtr)0x0) &&
     (local_20.second._M_current =
           ((local_20.first)->children_).
           super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
           ._M_impl.super__Vector_impl_data._M_start,
     local_20.second._M_current !=
     ((local_20.first)->children_).
     super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    std::
    deque<std::pair<spvtools::opt::DominatorTreeNode*,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode**,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>,std::allocator<std::pair<spvtools::opt::DominatorTreeNode*,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode**,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>>>
    ::
    emplace_back<std::pair<spvtools::opt::DominatorTreeNode*,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode**,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>>
              ((deque<std::pair<spvtools::opt::DominatorTreeNode*,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode**,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>,std::allocator<std::pair<spvtools::opt::DominatorTreeNode*,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode**,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>>>
                *)&__return_storage_ptr__->parent_iterators_,&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

df_iterator df_end() { return df_iterator(); }